

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int TPZFMatrix<long_double>::Substitution
              (longdouble *ptr,int64_t rows,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  int64_t iVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  long lVar10;
  longdouble lVar11;
  TPZVec<long_double> v;
  TPZVec<long_double> local_48;
  
  if (B == (TPZFMatrix<long_double> *)0x0) {
    poVar3 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "static int TPZFMatrix<long double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = long double]"
               ,0x85);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZFMatrix<>*B eh nulo",0x16);
    lVar4 = std::cerr;
  }
  else {
    if ((index->fNElements == rows) &&
       ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == rows)) {
      TPZVec<long_double>::TPZVec(&local_48,rows);
      if (0 < rows) {
        piVar1 = index->fStore;
        plVar6 = B->fElem;
        lVar4 = 0;
        plVar5 = local_48.fStore;
        do {
          *plVar5 = plVar6[piVar1[lVar4]];
          lVar4 = lVar4 + 1;
          plVar5 = plVar5 + 1;
        } while (rows != lVar4);
      }
      if (0 < rows) {
        lVar4 = 0;
        lVar11 = (longdouble)0;
        plVar6 = ptr;
        plVar5 = local_48.fStore;
        plVar8 = ptr;
        lVar10 = lVar4;
        do {
          for (; lVar4 != 0; lVar4 = lVar4 + -1) {
            lVar11 = *plVar5 * *plVar6 + lVar11;
            plVar6 = plVar6 + rows;
            plVar5 = plVar5 + 1;
          }
          local_48.fStore[lVar10] = local_48.fStore[lVar10] - lVar11;
          lVar4 = lVar10 + 1;
          plVar6 = plVar8 + 1;
          lVar11 = (longdouble)0;
          plVar5 = local_48.fStore;
          plVar8 = plVar6;
          lVar10 = lVar4;
        } while (lVar4 != rows);
      }
      if (0 < rows) {
        plVar5 = (longdouble *)((long)ptr + (rows * 0x10 + 0x10U) * rows + -0x10);
        plVar6 = local_48.fStore + rows;
        lVar4 = 0;
        iVar7 = rows;
        do {
          plVar8 = plVar6;
          plVar9 = plVar5;
          lVar10 = lVar4;
          lVar11 = (longdouble)0;
          if (iVar7 < rows) {
            do {
              lVar11 = *plVar8 * *plVar9 + lVar11;
              lVar10 = lVar10 + -1;
              plVar8 = plVar8 + 1;
              plVar9 = plVar9 + rows;
            } while (lVar10 != 0);
          }
          lVar10 = iVar7 + -1;
          local_48.fStore[lVar10] = (local_48.fStore[lVar10] - lVar11) / ptr[lVar10 * (rows + 1)];
          lVar4 = lVar4 + 1;
          plVar5 = (longdouble *)((long)plVar5 + (rows * 0x10 ^ 0xfffffffffffffff0U));
          plVar6 = plVar6 + -1;
          bVar2 = 1 < iVar7;
          iVar7 = lVar10;
        } while (bVar2);
      }
      if (0 < rows) {
        plVar6 = B->fElem;
        lVar4 = 0;
        do {
          *(unkbyte10 *)((long)plVar6 + lVar4) = *(unkbyte10 *)((long)local_48.fStore + lVar4);
          lVar4 = lVar4 + 0x10;
          rows = rows + -1;
        } while (rows != 0);
      }
      local_48._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
      if (local_48.fStore != (longdouble *)0x0) {
        operator_delete__(local_48.fStore);
      }
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_35dfef,0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"this->fIndex = ",0xf);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  b = ",6);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    lVar4 = *(long *)poVar3;
  }
  std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}